

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

int Fl::has_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *pCVar1;
  Check **ppCVar2;
  
  ppCVar2 = &first_check;
  while ((pCVar1 = *ppCVar2, pCVar1 != (Check *)0x0 && ((pCVar1->cb != cb || (pCVar1->arg != argp)))
         )) {
    ppCVar2 = &pCVar1->next;
  }
  return (int)(pCVar1 != (Check *)0x0);
}

Assistant:

int Fl::has_check(Fl_Timeout_Handler cb, void *argp) {
  for (Check** p = &first_check; *p;) {
    Check* t = *p;
    if (t->cb == cb && t->arg == argp) {
      return 1;
    } else {
      p = &(t->next);
    }
  }
  return 0;
}